

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_buf.c
# Opt level: O1

ssize_t tnt_buf_writev(tnt_stream *s,iovec *iov,int count)

{
  long *plVar1;
  void *__dest;
  ssize_t sVar2;
  long lVar3;
  long lVar4;
  
  sVar2 = -1;
  if (*(int *)((long)s->data + 0x38) != 1) {
    if (count < 1) {
      lVar4 = 0;
    }
    else {
      lVar3 = 0;
      lVar4 = 0;
      do {
        lVar4 = lVar4 + *(long *)((long)&iov->iov_len + lVar3);
        lVar3 = lVar3 + 0x10;
      } while ((ulong)(uint)count << 4 != lVar3);
    }
    __dest = (void *)(**(code **)((long)s->data + 0x20))(s,lVar4);
    sVar2 = -1;
    if (__dest != (void *)0x0) {
      if (0 < count) {
        lVar3 = 0;
        do {
          memcpy(__dest,*(void **)((long)&iov->iov_base + lVar3),
                 *(size_t *)((long)&iov->iov_len + lVar3));
          __dest = (void *)((long)__dest + *(long *)((long)&iov->iov_len + lVar3));
          lVar3 = lVar3 + 0x10;
        } while ((ulong)(uint)count << 4 != lVar3);
      }
      plVar1 = (long *)((long)s->data + 8);
      *plVar1 = *plVar1 + lVar4;
      s->wrcnt = s->wrcnt + 1;
      sVar2 = lVar4;
    }
  }
  return sVar2;
}

Assistant:

static ssize_t
tnt_buf_writev(struct tnt_stream *s, struct iovec *iov, int count) {
	if (TNT_SBUF_CAST(s)->as == 1) return -1;
	size_t size = 0;
	int i;
	for (i = 0 ; i < count ; i++)
		size += iov[i].iov_len;
	char *p = TNT_SBUF_CAST(s)->resize(s, size);
	if (p == NULL)
		return -1;
	for (i = 0 ; i < count ; i++) {
		memcpy(p, iov[i].iov_base, iov[i].iov_len);
		p += iov[i].iov_len;
	}
	TNT_SBUF_CAST(s)->size += size;
	s->wrcnt++;
	return size;
}